

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::DistItemBaseSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((kind == DefaultDistItem) || (kind == DistItem)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DistItemBaseSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefaultDistItem:
        case SyntaxKind::DistItem:
            return true;
        default:
            return false;
    }
}